

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O2

string * tinyusdz::value::print_array_snipped<double>
                   (string *__return_storage_ptr__,double *vals,size_t n,size_t N)

{
  ulong uVar1;
  size_t i;
  ulong uVar2;
  size_t sVar3;
  stringstream os;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if (N == 0 || n <= N * 2) {
    ::std::operator<<(local_1a8,"[");
    for (sVar3 = 0; n != sVar3; sVar3 = sVar3 + 1) {
      if (sVar3 != 0) {
        ::std::operator<<(local_1a8,", ");
      }
      ::std::ostream::_M_insert<double>(vals[sVar3]);
    }
  }
  else {
    uVar1 = n - N;
    if (n < N) {
      N = n;
    }
    ::std::operator<<(local_1a8,"[");
    for (uVar2 = 0; N != uVar2; uVar2 = uVar2 + 1) {
      if (uVar2 != 0) {
        ::std::operator<<(local_1a8,", ");
      }
      ::std::ostream::_M_insert<double>(vals[uVar2]);
    }
    if (N < uVar1) {
      N = uVar1;
    }
    ::std::operator<<(local_1a8,", ..., ");
    for (uVar1 = N; uVar1 < n; uVar1 = uVar1 + 1) {
      if (N < uVar1) {
        ::std::operator<<(local_1a8,", ");
      }
      ::std::ostream::_M_insert<double>(vals[uVar1]);
    }
  }
  ::std::operator<<(local_1a8,"]");
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_array_snipped(const T *vals, size_t n, size_t N = 16) {
  std::stringstream os;

  if ((N == 0) || ((N * 2) >= n)) {
    os << "[";
    for (size_t i = 0; i < n; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << vals[i];
    }
    os << "]";
  } else {
    size_t head_end = (std::min)(N, n);
    size_t tail_start = (std::max)(n - N, head_end);

    os << "[";

    for (size_t i = 0; i < head_end; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << vals[i];
    }

    os << ", ..., ";

    for (size_t i = tail_start; i < n; i++) {
      if (i > tail_start) {
        os << ", ";
      }
      os << vals[i];
    }

    os << "]";
  }
  return os.str();
}